

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

TagHistoryModePolicy * __thiscall
despot::TagHistoryModePolicy::ComputeMode(TagHistoryModePolicy *this,Belief *belief)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  long *in_RDX;
  long *plVar5;
  double dVar6;
  double dVar7;
  
  plVar4 = (long *)(**(code **)(*in_RDX + 0x30))();
  despot::State::State((State *)this);
  lVar1 = *(long *)(belief + 0x90);
  plVar2 = (long *)*plVar4;
  plVar4 = (long *)plVar4[1];
  dVar6 = 0.0;
  plVar5 = plVar2;
  while (plVar4 != plVar2) {
    lVar3 = *plVar5;
    dVar7 = *(double *)(lVar3 + 0x18) + *(double *)(lVar1 + (long)*(int *)(lVar3 + 0xc) * 8);
    *(double *)(lVar1 + (long)*(int *)(lVar3 + 0xc) * 8) = dVar7;
    if (dVar6 < dVar7) {
      this->field_0x8 = *(undefined1 *)(lVar3 + 8);
      *(undefined4 *)&this->field_0x14 = *(undefined4 *)(lVar3 + 0x14);
      *(undefined8 *)&this->field_0xc = *(undefined8 *)(lVar3 + 0xc);
      *(double *)&this->field_0x18 = dVar7;
      dVar6 = dVar7;
    }
    plVar5 = plVar5 + 1;
  }
  return this;
}

Assistant:

State ComputeMode(Belief* belief) const {
		const vector<State*>& particles = static_cast<ParticleBelief*>(belief)->particles();
		double maxWeight = 0;
		State mode;
		for (int i = 0; particles.size(); i++) {
			State* particle = particles[i];
			int id = particle->state_id;
			state_probs_[id] += particle->weight;

			if (state_probs_[id] > maxWeight) {
				maxWeight = state_probs_[id];
				mode = *particle;
				mode.weight = maxWeight;
			}
		}

		for (int i = 0; i < particles.size(); i++) {
			state_probs_[particles[i]->state_id] = 0;
		}

		return mode;
	}